

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxKeys.cxx
# Opt level: O3

PressedKey __thiscall LinuxKeys::pressed(LinuxKeys *this)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  int charactersBuffered;
  int local_1c;
  
  local_1c = 0;
  uVar3 = 0;
  ioctl(this->stdinFd_,0x541b,&local_1c);
  iVar1 = local_1c;
  if (local_1c == 1) {
    uVar2 = fgetc(_stdin);
    local_1c = local_1c + -1;
    uVar3 = (ulong)uVar2 << 0x20;
  }
  for (; local_1c != 0; local_1c = local_1c + -1) {
    fgetc(_stdin);
  }
  return (PressedKey)(uVar3 | iVar1 != 0);
}

Assistant:

LinuxKeys::PressedKey
LinuxKeys::pressed() const
{
    int charactersBuffered = 0;
    ioctl(stdinFd_, FIONREAD, &charactersBuffered);

    PressedKey keys((charactersBuffered != 0));

    if (charactersBuffered == 1)
    {
        keys.key = fgetc(stdin);
        --charactersBuffered;
    }

    while (charactersBuffered)
    {
        fgetc(stdin);
        --charactersBuffered;
    }

    return keys;
}